

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_start_write(nni_ws *ws)

{
  uint local_3c;
  undefined1 auStack_38 [4];
  int niov;
  nni_iov iov [2];
  ws_frame *frame;
  nni_ws *ws_local;
  
  if (((ws->txframe == (ws_frame *)0x0) && ((ws->ready & 1U) != 0)) &&
     (iov[1].iov_len = (size_t)nni_list_first(&ws->txq), (void *)iov[1].iov_len != (void *)0x0)) {
    if ((void *)iov[1].iov_len == (void *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/websocket.c"
                ,0x214,"frame != NULL");
    }
    nni_list_remove(&ws->txq,(void *)iov[1].iov_len);
    ws->txframe = (ws_frame *)iov[1].iov_len;
    local_3c = 1;
    iov[0].iov_buf = *(void **)(iov[1].iov_len + 0xa0);
    _auStack_38 = (void *)(iov[1].iov_len + 0x10);
    if (*(long *)(iov[1].iov_len + 0xa8) != 0) {
      local_3c = 2;
      iov[1].iov_buf = *(void **)(iov[1].iov_len + 0xa8);
      iov[0].iov_len = *(size_t *)(iov[1].iov_len + 200);
    }
    nni_aio_set_iov(&ws->txaio,local_3c,(nni_iov *)auStack_38);
    nni_http_write_full(ws->http,&ws->txaio);
  }
  return;
}

Assistant:

static void
ws_start_write(nni_ws *ws)
{
	ws_frame *frame;
	nni_iov   iov[2];
	int       niov;

	if ((ws->txframe != NULL) || (!ws->ready)) {
		return; // busy
	}

	if ((frame = nni_list_first(&ws->txq)) == NULL) {
		return; // nothing to send
	}
	NNI_ASSERT(frame != NULL);
	nni_list_remove(&ws->txq, frame);

	// Push it out.
	ws->txframe    = frame;
	niov           = 1;
	iov[0].iov_len = frame->hlen;
	iov[0].iov_buf = frame->head;
	if (frame->len > 0) {
		niov++;
		iov[1].iov_len = frame->len;
		iov[1].iov_buf = frame->buf;
	}
	nni_aio_set_iov(&ws->txaio, niov, iov);
	nni_http_write_full(ws->http, &ws->txaio);
}